

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O2

void leveldb::_Test_EncodingOutput::_RunIt(void)

{
  int iStack_1d4;
  size_type sStack_1d0;
  string sStack_1c8;
  Tester TStack_1a8;
  
  sStack_1c8._M_dataplus._M_p = (pointer)&sStack_1c8.field_2;
  sStack_1c8._M_string_length = 0;
  sStack_1c8.field_2._M_local_buf[0] = '\0';
  PutFixed32(&sStack_1c8,0x4030201);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x3b);
  iStack_1d4 = 4;
  sStack_1d0 = sStack_1c8._M_string_length;
  test::Tester::IsEq<int,unsigned_long>(&TStack_1a8,&iStack_1d4,&sStack_1d0);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x3c);
  sStack_1d0._0_4_ = 1;
  iStack_1d4 = (int)*sStack_1c8._M_dataplus._M_p;
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x3d);
  sStack_1d0._0_4_ = 2;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[1];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x3e);
  sStack_1d0._0_4_ = 3;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[2];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x3f);
  sStack_1d0 = CONCAT44(sStack_1d0._4_4_,4);
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[3];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  sStack_1c8._M_string_length = 0;
  *sStack_1c8._M_dataplus._M_p = '\0';
  PutFixed64(&sStack_1c8,0x807060504030201);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x43);
  iStack_1d4 = 8;
  sStack_1d0 = sStack_1c8._M_string_length;
  test::Tester::IsEq<int,unsigned_long>(&TStack_1a8,&iStack_1d4,&sStack_1d0);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x44);
  sStack_1d0._0_4_ = 1;
  iStack_1d4 = (int)*sStack_1c8._M_dataplus._M_p;
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x45);
  sStack_1d0._0_4_ = 2;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[1];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x46);
  sStack_1d0._0_4_ = 3;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[2];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x47);
  sStack_1d0._0_4_ = 4;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[3];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x48);
  sStack_1d0._0_4_ = 5;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[4];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x49);
  sStack_1d0._0_4_ = 6;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[5];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x4a);
  sStack_1d0._0_4_ = 7;
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[6];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  test::Tester::Tester
            (&TStack_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
             ,0x4b);
  sStack_1d0 = CONCAT44(sStack_1d0._4_4_,8);
  iStack_1d4 = (int)sStack_1c8._M_dataplus._M_p[7];
  test::Tester::IsEq<int,int>(&TStack_1a8,(int *)&sStack_1d0,&iStack_1d4);
  test::Tester::~Tester(&TStack_1a8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  return;
}

Assistant:

TEST(Coding, EncodingOutput) {
  std::string dst;
  PutFixed32(&dst, 0x04030201);
  ASSERT_EQ(4, dst.size());
  ASSERT_EQ(0x01, static_cast<int>(dst[0]));
  ASSERT_EQ(0x02, static_cast<int>(dst[1]));
  ASSERT_EQ(0x03, static_cast<int>(dst[2]));
  ASSERT_EQ(0x04, static_cast<int>(dst[3]));

  dst.clear();
  PutFixed64(&dst, 0x0807060504030201ull);
  ASSERT_EQ(8, dst.size());
  ASSERT_EQ(0x01, static_cast<int>(dst[0]));
  ASSERT_EQ(0x02, static_cast<int>(dst[1]));
  ASSERT_EQ(0x03, static_cast<int>(dst[2]));
  ASSERT_EQ(0x04, static_cast<int>(dst[3]));
  ASSERT_EQ(0x05, static_cast<int>(dst[4]));
  ASSERT_EQ(0x06, static_cast<int>(dst[5]));
  ASSERT_EQ(0x07, static_cast<int>(dst[6]));
  ASSERT_EQ(0x08, static_cast<int>(dst[7]));
}